

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpAgent.cpp
# Opt level: O0

int parseChunkLine(CircularBuffer *buf,int *len)

{
  int iVar1;
  long lVar2;
  int local_54;
  int local_50;
  int c;
  int j;
  int i;
  char length_str [40];
  int *len_local;
  CircularBuffer *buf_local;
  
  c = 0;
  local_50 = 0;
  length_str._32_8_ = len;
  iVar1 = JetHead::CircularBuffer::getLength(buf);
  if (iVar1 == 0) {
    return -1;
  }
  while( true ) {
    local_54 = JetHead::CircularBuffer::byteAt(buf,c);
    if (local_54 < 0) {
      return local_54;
    }
    if ((local_54 == 0x3b) || (local_54 == 0xd)) break;
    *(char *)((long)&j + (long)local_50) = (char)local_54;
    local_50 = local_50 + 1;
    c = c + 1;
  }
  *(undefined1 *)((long)&j + (long)local_50) = 0;
  c = c + 1;
  do {
    if (local_54 == 0xd) {
      iVar1 = JetHead::CircularBuffer::byteAt(buf,c);
      if (iVar1 == 10) {
        lVar2 = strtol((char *)&j,(char **)0x0,0x10);
        *(int *)length_str._32_8_ = (int)lVar2;
        return c + 1;
      }
      return -1;
    }
    local_54 = JetHead::CircularBuffer::byteAt(buf,c);
    c = c + 1;
  } while (-1 < local_54);
  return local_54;
}

Assistant:

int parseChunkLine( const CircularBuffer &buf, int &len )
{
	TRACE_BEGIN( LOG_LVL_INFO );

	char length_str[ 40 ];
	int i = 0;
	int j = 0;
	int c;

	if (!buf.getLength())
		return -1;
				
	while ( 1 )
	{
		c = buf.byteAt( i++ );	

		if ( c < 0 )
			return c;

		if ( c == ';' || c == '\r')
			break;
		length_str[ j++ ] = c;
	}

	length_str[ j ] = 0;

	while ( c != '\r' )
	{
		c = buf.byteAt( i++ );	

		if ( c < 0 )
			return c;
	}
	
	// if CRLF move past LF
	c = buf.byteAt(i);
	if ( c == '\n' )
		i++;
	else
		return -1;
		
	len = strtol( length_str, NULL, 16 );

	LOG( "string %s", length_str );
	return i;
}